

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O2

iterator __thiscall SystemCatalog::getType(SystemCatalog *this,string *typeName)

{
  int iVar1;
  _Base_ptr p_Var2;
  
  p_Var2 = (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->types)._M_t._M_impl.super__Rb_tree_header) {
      return (iterator)p_Var2;
    }
    iVar1 = std::__cxx11::string::compare((string *)(p_Var2 + 1));
    if (iVar1 == 0) break;
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  return (iterator)p_Var2;
}

Assistant:

set<type>::iterator SystemCatalog::getType(string &typeName) {
    set<type>::iterator i;

    for (i = types.begin(); i != types.end(); ++i) {
        if (i->typeName.compare(typeName) == 0) { break; }
    }

    return i;
}